

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall glslang::TVarSetTraverser::visitSymbol(TVarSetTraverser *this,TIntermSymbol *base)

{
  uint uVar1;
  TLayoutPacking TVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer ppVar5;
  undefined4 extraout_var_04;
  long lVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TQualifier *this_00;
  undefined4 extraout_var_11;
  _Self local_60;
  _Self local_58;
  const_iterator at;
  TVarEntryInfo ent;
  TVarLiveMap *source;
  TIntermSymbol *base_local;
  TVarSetTraverser *this_local;
  
  iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if (((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) == 3) {
    ent._40_8_ = this->inputList;
  }
  else {
    iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0x7f) == 4) {
      ent._40_8_ = this->outputList;
    }
    else {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      bVar3 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_01,iVar4));
      if (!bVar3) {
        return;
      }
      ent._40_8_ = this->uniformList;
    }
  }
  memset(&at,0,0x30);
  iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  at._M_node = (_Base_ptr)CONCAT44(extraout_var_02,iVar4);
  iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               *)ent._40_8_,(key_type *)CONCAT44(extraout_var_03,iVar4));
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
              *)ent._40_8_);
  bVar3 = std::operator==(&local_58,&local_60);
  if ((!bVar3) &&
     (ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58), (_Base_ptr)(ppVar5->second).id == at._M_node)) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).newBinding != -1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      uVar1 = (ppVar5->second).newBinding;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x50))();
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffff0000ffffffff | ((ulong)uVar1 & 0xffff) << 0x20;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).newSet != -1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      uVar1 = (ppVar5->second).newSet;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x50))();
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffffffffffc07fff | ((ulong)uVar1 & 0x7f) << 0xf;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).newLocation != -1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      uVar1 = (ppVar5->second).newLocation;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x50))();
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xfffffffffffff000 | (ulong)uVar1 & 0xfff;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).newComponent != -1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      uVar1 = (ppVar5->second).newComponent;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x50))();
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xffffffffffff8fff | ((ulong)uVar1 & 7) << 0xc;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).newIndex != -1) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      uVar1 = (ppVar5->second).newIndex;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x50))();
      *(ulong *)(lVar6 + 0x1c) =
           *(ulong *)(lVar6 + 0x1c) & 0xff00ffffffffffff | ((ulong)uVar1 & 0xff) << 0x30;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
             ::operator->(&local_58);
    if ((ppVar5->second).upgradedToPushConstantPacking != ElpNone) {
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0x50))();
      *(undefined1 *)(lVar6 + 0x2d) = 1;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x50))();
      TQualifier::setBlockStorage(this_00,EbsPushConstant);
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      TVar2 = (ppVar5->second).upgradedToPushConstantPacking;
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x50))();
      *(byte *)(lVar6 + 0x10) = *(byte *)(lVar6 + 0x10) & 0xf0 | (byte)TVar2 & 0xf;
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* base) {
        const TVarLiveMap* source;
        if (base->getQualifier().storage == EvqVaryingIn)
            source = &inputList;
        else if (base->getQualifier().storage == EvqVaryingOut)
            source = &outputList;
        else if (base->getQualifier().isUniformOrBuffer())
            source = &uniformList;
        else
            return;

        TVarEntryInfo ent = { base->getId(), {}, {}, {}, {}, {}, {}, {}, {}, {} };
        // Fix a defect, when block has no instance name, we need to find its block name
        TVarLiveMap::const_iterator at = source->find(base->getAccessName());
        if (at == source->end())
            return;

        if (at->second.id != ent.id)
            return;

        if (at->second.newBinding != -1)
            base->getWritableType().getQualifier().layoutBinding = at->second.newBinding;
        if (at->second.newSet != -1)
            base->getWritableType().getQualifier().layoutSet = at->second.newSet;
        if (at->second.newLocation != -1)
            base->getWritableType().getQualifier().layoutLocation = at->second.newLocation;
        if (at->second.newComponent != -1)
            base->getWritableType().getQualifier().layoutComponent = at->second.newComponent;
        if (at->second.newIndex != -1)
            base->getWritableType().getQualifier().layoutIndex = at->second.newIndex;
        if (at->second.upgradedToPushConstantPacking != ElpNone) {
            base->getWritableType().getQualifier().layoutPushConstant = true;
            base->getWritableType().getQualifier().setBlockStorage(EbsPushConstant);
            base->getWritableType().getQualifier().layoutPacking = at->second.upgradedToPushConstantPacking;
        }
    }